

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fluid.hpp
# Opt level: O1

void __thiscall Fluid::apply_body_forces(Fluid *this,float dt)

{
  PFNGLUNIFORM1FPROC p_Var1;
  PFNGLUNIFORM3FVPROC p_Var2;
  PFNGLUNIFORM3IVPROC p_Var3;
  GLint GVar4;
  vec3 body_force;
  undefined8 local_e0;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_d8;
  long *local_d0 [2];
  long local_c0 [2];
  long *local_b0 [2];
  long local_a0 [2];
  long *local_90 [2];
  long local_80 [2];
  long *local_70 [2];
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  (*glad_glMemoryBarrier)(0xffffffff);
  gfx::Program::use(&this->body_forces_program);
  p_Var1 = glad_glUniform1f;
  local_d8 = (this->gravity).field_2;
  local_e0._0_4_ = (this->gravity).field_0;
  local_e0._4_4_ = (this->gravity).field_1;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"dt","");
  GVar4 = (*glad_glGetUniformLocation)((this->body_forces_program).id,(GLchar *)local_50[0]);
  (*p_Var1)(GVar4,dt);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  p_Var2 = glad_glUniform3fv;
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"bounds_min","");
  GVar4 = (*glad_glGetUniformLocation)((this->body_forces_program).id,(GLchar *)local_70[0]);
  (*p_Var2)(GVar4,1,(GLfloat *)&this->bounds_min);
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  p_Var2 = glad_glUniform3fv;
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"bounds_max","");
  GVar4 = (*glad_glGetUniformLocation)((this->body_forces_program).id,(GLchar *)local_90[0]);
  (*p_Var2)(GVar4,1,(GLfloat *)&this->bounds_max);
  if (local_90[0] != local_80) {
    operator_delete(local_90[0],local_80[0] + 1);
  }
  p_Var3 = glad_glUniform3iv;
  local_b0[0] = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"grid_dim","");
  GVar4 = (*glad_glGetUniformLocation)((this->body_forces_program).id,(GLchar *)local_b0[0]);
  (*p_Var3)(GVar4,1,(GLint *)&this->grid_dimensions);
  if (local_b0[0] != local_a0) {
    operator_delete(local_b0[0],local_a0[0] + 1);
  }
  p_Var2 = glad_glUniform3fv;
  local_d0[0] = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"body_force","");
  GVar4 = (*glad_glGetUniformLocation)((this->body_forces_program).id,(GLchar *)local_d0[0]);
  (*p_Var2)(GVar4,1,(GLfloat *)&local_e0);
  if (local_d0[0] != local_c0) {
    operator_delete(local_d0[0],local_c0[0] + 1);
  }
  (*glad_glValidateProgram)((this->body_forces_program).id);
  gfx::Program::check_validation(&this->body_forces_program,(this->body_forces_program).id);
  (*glad_glDispatchCompute)
            ((this->grid_dimensions).field_0.x,(this->grid_dimensions).field_1.y,
             (this->grid_dimensions).field_2.z);
  (*glad_glUseProgram)(0);
  return;
}

Assistant:

void apply_body_forces(float dt) {
        // also enforces boundary condition
        ssbo_barrier();
        body_forces_program.use();
        const glm::vec3 body_force = gravity; // TODO: other forces?
        glUniform1f(body_forces_program.uniform_loc("dt"), dt);
        glUniform3fv(body_forces_program.uniform_loc("bounds_min"), 1, glm::value_ptr(bounds_min));
        glUniform3fv(body_forces_program.uniform_loc("bounds_max"), 1, glm::value_ptr(bounds_max));
        glUniform3iv(body_forces_program.uniform_loc("grid_dim"), 1, glm::value_ptr(grid_dimensions));
        glUniform3fv(body_forces_program.uniform_loc("body_force"), 1, glm::value_ptr(body_force));
        body_forces_program.validate();
        glDispatchCompute(grid_dimensions.x, grid_dimensions.y, grid_dimensions.z);
        body_forces_program.disuse();
    }